

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O0

value * mjs::string_match(value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                         string *str,value *regexp)

{
  undefined8 uVar1;
  regexp_flag rVar2;
  value_type vVar3;
  regexp_object *prVar4;
  global_object *this;
  gc_heap *h_00;
  object *poVar5;
  object *poVar6;
  uint32_t index;
  double dVar7;
  wstring_view wVar8;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_118;
  value local_108;
  wstring local_e0;
  wstring_view local_c0;
  string local_b0;
  object_ptr *local_a0;
  object_ptr *match_object;
  value match;
  double last_index_before;
  uint32_t i;
  gc_heap *h;
  object_ptr res;
  undefined1 local_38 [8];
  gc_heap_ptr<mjs::regexp_object> re;
  value *regexp_local;
  string *str_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  re.super_gc_heap_ptr_untyped._8_8_ = regexp;
  anon_unknown_35::to_regexp_object((anon_unknown_35 *)local_38,global,regexp);
  prVar4 = gc_heap_ptr<mjs::regexp_object>::operator->((gc_heap_ptr<mjs::regexp_object> *)local_38);
  rVar2 = regexp_object::flags(prVar4);
  rVar2 = operator&(rVar2,global);
  if (rVar2 == none) {
    prVar4 = gc_heap_ptr<mjs::regexp_object>::operator->
                       ((gc_heap_ptr<mjs::regexp_object> *)local_38);
    regexp_object::exec(__return_storage_ptr__,prVar4,str);
    res.super_gc_heap_ptr_untyped.pos_ = 1;
  }
  else {
    prVar4 = gc_heap_ptr<mjs::regexp_object>::operator->
                       ((gc_heap_ptr<mjs::regexp_object> *)local_38);
    regexp_object::last_index(prVar4,0);
    make_array((mjs *)&h,global,0);
    this = gc_heap_ptr<mjs::global_object>::operator->(global);
    h_00 = object::heap(&this->super_object);
    last_index_before._4_4_ = 0;
    while( true ) {
      prVar4 = gc_heap_ptr<mjs::regexp_object>::operator->
                         ((gc_heap_ptr<mjs::regexp_object> *)local_38);
      match.field_1._24_8_ = regexp_object::last_index(prVar4);
      prVar4 = gc_heap_ptr<mjs::regexp_object>::operator->
                         ((gc_heap_ptr<mjs::regexp_object> *)local_38);
      regexp_object::exec((value *)&match_object,prVar4,str);
      vVar3 = value::type((value *)&match_object);
      if (vVar3 == null) {
        res.super_gc_heap_ptr_untyped.pos_ = 2;
      }
      else {
        vVar3 = value::type((value *)&match_object);
        if (vVar3 != object) {
          __assert_fail("match.type() == value_type::object",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp_object.cpp"
                        ,0x1af,
                        "value mjs::string_match(const gc_heap_ptr<global_object> &, const string &, const value &)"
                       );
        }
        local_a0 = value::object_value((value *)&match_object);
        poVar5 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)&h);
        index_string_abi_cxx11_(&local_e0,(mjs *)(ulong)last_index_before._4_4_,index);
        wVar8 = (wstring_view)
                std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_e0);
        local_c0 = wVar8;
        string::string(&local_b0,h_00,&local_c0);
        poVar6 = gc_heap_ptr<mjs::object>::operator->(local_a0);
        std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                  (&local_118,L"0");
        (**poVar6->_vptr_object)(&local_108,poVar6,&local_118);
        (*poVar5->_vptr_object[1])(poVar5,&local_b0,&local_108,0);
        value::~value(&local_108);
        string::~string(&local_b0);
        std::__cxx11::wstring::~wstring((wstring *)&local_e0);
        uVar1 = match.field_1._24_8_;
        prVar4 = gc_heap_ptr<mjs::regexp_object>::operator->
                           ((gc_heap_ptr<mjs::regexp_object> *)local_38);
        dVar7 = regexp_object::last_index(prVar4);
        if (((double)uVar1 == dVar7) && (!NAN((double)uVar1) && !NAN(dVar7))) {
          prVar4 = gc_heap_ptr<mjs::regexp_object>::operator->
                             ((gc_heap_ptr<mjs::regexp_object> *)local_38);
          regexp_object::last_index(prVar4,(uint32_t)(long)(match.field_1._24_8_ + 1.0));
        }
        res.super_gc_heap_ptr_untyped.pos_ = 0;
      }
      value::~value((value *)&match_object);
      if (res.super_gc_heap_ptr_untyped.pos_ != 0) break;
      last_index_before._4_4_ = last_index_before._4_4_ + 1;
    }
    value::value(__return_storage_ptr__,(object_ptr *)&h);
    res.super_gc_heap_ptr_untyped.pos_ = 1;
    gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)&h);
  }
  gc_heap_ptr<mjs::regexp_object>::~gc_heap_ptr((gc_heap_ptr<mjs::regexp_object> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

value string_match(const gc_heap_ptr<global_object>& global, const string& str, const value& regexp) {
    auto re = to_regexp_object(global, regexp);
    if ((re->flags() & regexp_flag::global) == regexp_flag::none) {
        return re->exec(str);
    }
    // Global regexp
    re->last_index(0);

    auto res = make_array(global, 0);
    auto& h = global->heap();
    for (uint32_t i=0;; ++i) {
        const auto last_index_before = re->last_index();
        auto match = re->exec(str);
        if (match.type() == value_type::null) {
            break;
        }
        assert(match.type() == value_type::object);
        const auto& match_object = match.object_value();
        res->put(string{h, index_string(i)}, match_object->get(L"0"));
        if (last_index_before == re->last_index()) {
            // Empty match
            re->last_index(static_cast<uint32_t>(last_index_before + 1));
        }
    }
    return value{res};
}